

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_spin_flip.hpp
# Opt level: O1

void openjij::updater::
     SingleFlipUpdater<openjij::system::SASystem<openjij::graph::IsingPolynomialModel<double>,openjij::utility::Xorshift>,openjij::utility::Xorshift>
               (SASystem<openjij::graph::IsingPolynomialModel<double>,_openjij::utility::Xorshift>
                *system,int32_t num_sweeps,vector<double,_std::allocator<double>_> *beta_list,
               result_type seed,UpdateMethod update_metod)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  runtime_error *this;
  ulong uVar4;
  ulong uVar5;
  Xorshift random_number_engine;
  Xorshift local_58;
  double local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar1 = system->system_size_;
  local_58.x = 0x75bcd15;
  local_58.y = 0x159a55e5;
  local_58.z = 0x1f123bb5;
  local_58.w = (uint)seed;
  if (update_metod == METROPOLIS) {
    if (0 < num_sweeps) {
      uVar4 = 0;
      do {
        if (0 < (int)uVar1) {
          local_48 = -(beta_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar4];
          uStack_40 = 0;
          uStack_3c = 0x80000000;
          uVar5 = 0;
          do {
            dVar2 = (double)((system->sample_).
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar5] * -2) *
                    (system->base_energy_difference_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
            if (dVar2 <= 0.0) {
LAB_00176037:
              openjij::system::
              SASystem<openjij::graph::IsingPolynomialModel<double>,_openjij::utility::Xorshift>::
              Flip(system,(int32_t)uVar5);
            }
            else {
              dVar2 = exp(dVar2 * local_48);
              dVar3 = std::generate_canonical<double,53ul,openjij::utility::Xorshift>(&local_58);
              if (dVar3 < dVar2) goto LAB_00176037;
            }
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)num_sweeps);
    }
  }
  else {
    if (update_metod != HEAT_BATH) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown UpdateMethod");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (0 < num_sweeps) {
      uVar4 = 0;
      do {
        if (0 < (int)uVar1) {
          local_48 = (beta_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar4];
          uVar5 = 0;
          do {
            dVar2 = exp((double)((system->sample_).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar5] * -2) *
                        (system->base_energy_difference_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar5] * local_48);
            dVar3 = std::generate_canonical<double,53ul,openjij::utility::Xorshift>(&local_58);
            if (dVar3 < 1.0 / (dVar2 + 1.0)) {
              openjij::system::
              SASystem<openjij::graph::IsingPolynomialModel<double>,_openjij::utility::Xorshift>::
              Flip(system,(int32_t)uVar5);
            }
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)num_sweeps);
    }
  }
  return;
}

Assistant:

void SingleFlipUpdater(SystemType *system,
                       const std::int32_t num_sweeps,
                       const std::vector<typename SystemType::ValueType> &beta_list,
                       const typename RandType::result_type seed,
                       const algorithm::UpdateMethod update_metod) {
   
   const std::int32_t system_size = system->GetSystemSize();
   
   // Set random number engine
   RandType random_number_engine(seed);
   std::uniform_real_distribution<typename SystemType::ValueType> dist_real(0, 1);
   
   if (update_metod == algorithm::UpdateMethod::METROPOLIS) {
      // Do sequential update
      for (std::int32_t sweep_count = 0; sweep_count < num_sweeps; sweep_count++) {
         const auto beta = beta_list[sweep_count];
         for (std::int32_t i = 0; i < system_size; i++) {
            const auto delta_energy = system->GetEnergyDifference(i);
            if (delta_energy <= 0 || std::exp(-beta*delta_energy) > dist_real(random_number_engine)) {
               system->Flip(i);
            }
         }
      }
   }
   else if (update_metod == algorithm::UpdateMethod::HEAT_BATH) {
      // Do sequential update
      for (std::int32_t sweep_count = 0; sweep_count < num_sweeps; sweep_count++) {
         const auto beta = beta_list[sweep_count];
         for (std::int32_t i = 0; i < system_size; i++) {
            const auto delta_energy = system->GetEnergyDifference(i);
            if (1/(1 + std::exp(beta*delta_energy)) > dist_real(random_number_engine)) {
               system->Flip(i);
            }
         }
      }
   }
   else {
      throw std::runtime_error("Unknown UpdateMethod");
   }
}